

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O3

void __thiscall ssl_credential_st::ClearCertAndKey(ssl_credential_st *this)

{
  std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)&this->pubkey,(pointer)0x0);
  std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)&this->privkey,(pointer)0x0);
  this->key_method = (SSL_PRIVATE_KEY_METHOD *)0x0;
  std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&this->chain,
             (pointer)0x0);
  return;
}

Assistant:

void ssl_credential_st::ClearCertAndKey() {
  pubkey = nullptr;
  privkey = nullptr;
  key_method = nullptr;
  chain = nullptr;
}